

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBarcodeValue.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
ZXing::Pdf417::BarcodeValue::value
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,BarcodeValue *this)

{
  int iVar1;
  undefined8 uVar2;
  iterator __position;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  const_iterator __end3;
  _Rb_tree_header *p_Var7;
  const_iterator __begin3;
  bool bVar8;
  undefined8 local_30;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->_values)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var4 = (this->_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(this->_values)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = p_Var4;
    if ((_Rb_tree_header *)p_Var4 != p_Var7) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      while ((_Rb_tree_header *)p_Var3 != p_Var7) {
        p_Var5 = p_Var3;
        if (*(int *)&p_Var3[1].field_0x4 <= *(int *)&p_Var6[1].field_0x4) {
          p_Var5 = p_Var6;
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        p_Var6 = p_Var5;
      }
    }
    if ((_Rb_tree_header *)p_Var4 != p_Var7) {
      iVar1 = *(int *)&p_Var6[1].field_0x4;
      do {
        uVar2 = *(undefined8 *)(p_Var4 + 1);
        local_30._4_4_ = (int)((ulong)uVar2 >> 0x20);
        bVar8 = local_30._4_4_ == iVar1;
        local_30 = uVar2;
        if (bVar8) {
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                       (int *)&local_30);
          }
          else {
            local_30._0_4_ = (int)uVar2;
            *__position._M_current = (int)local_30;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
BarcodeValue::value() const
{
	std::vector<int> result;
	if (!_values.empty()) {
		int maxConfidence = std::max_element(_values.begin(), _values.end(), [](auto& l, auto& r) { return l.second < r.second; })->second;
		for (auto [value, count] : _values)
			if (count == maxConfidence)
				result.push_back(value);
	}
	return result;
}